

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_predict_hbd_c(int16_t *ac_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bit_depth,
                      int width,int height)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int i;
  ulong uVar6;
  
  if (width < 1) {
    width = 0;
  }
  if (height < 1) {
    height = 0;
  }
  for (iVar2 = 0; iVar2 != height; iVar2 = iVar2 + 1) {
    for (uVar6 = 0; (uint)width != uVar6; uVar6 = uVar6 + 1) {
      iVar3 = get_scaled_luma_q0(alpha_q3,ac_buf_q3[uVar6]);
      uVar5 = (uint)dst[uVar6] + iVar3;
      uVar4 = uVar5;
      if (bit_depth == 10) {
        if (0x3fe < uVar5) {
          uVar4 = 0x3ff;
        }
      }
      else if (bit_depth == 0xc) {
        if (0xffe < uVar5) {
          uVar4 = 0xfff;
        }
      }
      else if (0xfe < uVar5) {
        uVar4 = 0xff;
      }
      uVar1 = (uint16_t)uVar4;
      if ((int)uVar5 < 0) {
        uVar1 = 0;
      }
      dst[uVar6] = uVar1;
    }
    ac_buf_q3 = ac_buf_q3 + 0x20;
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

static inline void cfl_predict_hbd_c(const int16_t *ac_buf_q3, uint16_t *dst,
                                     int dst_stride, int alpha_q3,
                                     int bit_depth, int width, int height) {
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = clip_pixel_highbd(
          get_scaled_luma_q0(alpha_q3, ac_buf_q3[i]) + dst[i], bit_depth);
    }
    dst += dst_stride;
    ac_buf_q3 += CFL_BUF_LINE;
  }
}